

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_set_r6_encryption_parameters2
               (qpdf_data qpdf,char *user_password,char *owner_password,
               QPDF_BOOL allow_accessibility,QPDF_BOOL allow_extract,QPDF_BOOL allow_assemble,
               QPDF_BOOL allow_annotate_and_form,QPDF_BOOL allow_form_filling,
               QPDF_BOOL allow_modify_other,qpdf_r3_print_e print,QPDF_BOOL encrypt_metadata)

{
  element_type *this;
  QPDF_BOOL allow_assemble_local;
  QPDF_BOOL allow_extract_local;
  QPDF_BOOL allow_accessibility_local;
  char *owner_password_local;
  char *user_password_local;
  qpdf_data qpdf_local;
  
  QTC::TC("qpdf","qpdf-c called qpdf_set_r6_encryption_parameters",0);
  this = std::__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    &qpdf->qpdf_writer);
  QPDFWriter::setR6EncryptionParameters
            (this,user_password,owner_password,allow_accessibility != 0,allow_extract != 0,
             allow_assemble != 0,allow_annotate_and_form != 0,allow_form_filling != 0,
             allow_modify_other != 0,print,encrypt_metadata != 0);
  return;
}

Assistant:

void
qpdf_set_r6_encryption_parameters2(
    qpdf_data qpdf,
    char const* user_password,
    char const* owner_password,
    QPDF_BOOL allow_accessibility,
    QPDF_BOOL allow_extract,
    QPDF_BOOL allow_assemble,
    QPDF_BOOL allow_annotate_and_form,
    QPDF_BOOL allow_form_filling,
    QPDF_BOOL allow_modify_other,
    enum qpdf_r3_print_e print,
    QPDF_BOOL encrypt_metadata)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_set_r6_encryption_parameters");
    qpdf->qpdf_writer->setR6EncryptionParameters(
        user_password,
        owner_password,
        allow_accessibility != QPDF_FALSE,
        allow_extract != QPDF_FALSE,
        allow_assemble != QPDF_FALSE,
        allow_annotate_and_form != QPDF_FALSE,
        allow_form_filling != QPDF_FALSE,
        allow_modify_other != QPDF_FALSE,
        print,
        encrypt_metadata != QPDF_FALSE);
}